

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

HelpColumns * __thiscall
Catch::Clara::Opt::getHelpColumns(HelpColumns *__return_storage_ptr__,Opt *this)

{
  pointer pSVar1;
  size_type sVar2;
  bool bVar3;
  ReusableStringStream *this_00;
  StringRef *opt;
  pointer value;
  ReusableStringStream oss;
  char local_41;
  ReusableStringStream local_40;
  
  ReusableStringStream::ReusableStringStream(&local_40);
  pSVar1 = (this->m_optNames).
           super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = true;
  for (value = (this->m_optNames).
               super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
               super__Vector_impl_data._M_start; value != pSVar1; value = value + 1) {
    if (!bVar3) {
      std::operator<<(local_40.m_oss,", ");
    }
    ReusableStringStream::operator<<(&local_40,value);
    bVar3 = false;
  }
  if ((this->super_ParserRefImpl<Catch::Clara::Opt>).m_hint.m_size != 0) {
    std::operator<<(local_40.m_oss," <");
    this_00 = ReusableStringStream::operator<<
                        (&local_40,&(this->super_ParserRefImpl<Catch::Clara::Opt>).m_hint);
    local_41 = '>';
    ReusableStringStream::operator<<(this_00,&local_41);
  }
  std::__cxx11::stringbuf::str();
  sVar2 = (this->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size;
  (__return_storage_ptr__->descriptions).m_start =
       (this->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start;
  (__return_storage_ptr__->descriptions).m_size = sVar2;
  ReusableStringStream::~ReusableStringStream(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Detail::HelpColumns Opt::getHelpColumns() const {
            ReusableStringStream oss;
            bool first = true;
            for (auto const& opt : m_optNames) {
                if (first)
                    first = false;
                else
                    oss << ", ";
                oss << opt;
            }
            if (!m_hint.empty())
                oss << " <" << m_hint << '>';
            return { oss.str(), m_description };
        }